

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC1TL3SLMultiRef_Test::
~DatarateTestSVC_BasicRateTargetingSVC1TL3SLMultiRef_Test
          (DatarateTestSVC_BasicRateTargetingSVC1TL3SLMultiRef_Test *this)

{
  void *in_RDI;
  
  ~DatarateTestSVC_BasicRateTargetingSVC1TL3SLMultiRef_Test
            ((DatarateTestSVC_BasicRateTargetingSVC1TL3SLMultiRef_Test *)0x7e5ab8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC1TL3SLMultiRef) {
  BasicRateTargetingSVC1TL3SLMultiRefTest();
}